

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcursor.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int hot_y;
  int hot_x;
  SDL_Cursor *cursor [3];
  Uint8 data [128];
  Uint8 mask [128];
  undefined4 local_160;
  undefined4 local_15c;
  long local_158 [4];
  byte local_138 [8];
  int local_130;
  byte local_b8 [136];
  
  iVar2 = SDL_Init(0x20);
  if (iVar2 < 0) {
    main_cold_5();
  }
  else {
    lVar4 = SDL_SetVideoMode(0x140,200,8,0x10000000);
    if (lVar4 == 0) {
      main_cold_4();
    }
    else {
      SDL_FillRect(lVar4,0,0x664422);
      lVar5 = SDL_CreateCursor(cursor_data,cursor_mask,0x10,0x10,8,8);
      local_158[0] = lVar5;
      if (lVar5 == 0) {
        main_cold_3();
      }
      else {
        lVar6 = 0xffffffff;
        lVar7 = 0;
        do {
          iVar2 = *(int *)(arrow_rel + lVar7 * 4 + 0x10);
          uVar8 = 0;
          do {
            iVar3 = (int)lVar6;
            if ((uVar8 & 7) == 0) {
              lVar9 = (long)iVar3;
              lVar6 = lVar9 + 1;
              local_b8[lVar9 + 1] = 0;
              local_138[lVar9 + 1] = 0;
            }
            else {
              local_138[iVar3] = local_138[iVar3] << 1;
              local_b8[iVar3] = local_b8[iVar3] << 1;
            }
            if (arrow_rel[(long)iVar2 + uVar8] == '.') {
LAB_001013d4:
              local_b8[(int)lVar6] = local_b8[(int)lVar6] | 1;
            }
            else if (arrow_rel[(long)iVar2 + uVar8] == 'X') {
              local_138[(int)lVar6] = local_138[(int)lVar6] | 1;
              goto LAB_001013d4;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != 0x20);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        __isoc99_sscanf("0,0","%d,%d",&local_15c,&local_160);
        lVar6 = SDL_CreateCursor(local_138,local_b8,0x20,0x20,local_15c,local_160);
        local_158[1] = lVar6;
        if (lVar6 == 0) {
          main_cold_2();
        }
        else {
          lVar7 = SDL_CreateCursor(small_cursor_data,small_cursor_mask,8,0xb,3,5);
          local_158[2] = lVar7;
          if (lVar7 != 0) {
            SDL_SetCursor(lVar5);
            iVar2 = 0;
            bVar1 = false;
            do {
              while (iVar3 = SDL_PollEvent(local_138), iVar3 != 0) {
                if (local_138[0] == 2) {
                  if (local_130 == 0x1b) {
                    bVar1 = true;
                  }
                }
                else if (local_138[0] == 0xc) {
                  bVar1 = true;
                }
                else if (local_138[0] == 5) {
                  iVar2 = (iVar2 + 1) % 3;
                  SDL_SetCursor(local_158[iVar2]);
                }
              }
              SDL_Flip(lVar4);
              SDL_Delay(1);
            } while (!bVar1);
            SDL_FreeCursor(lVar5);
            SDL_FreeCursor(lVar6);
            SDL_FreeCursor(lVar7);
            SDL_Quit();
            return 0;
          }
          main_cold_1();
        }
      }
    }
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_bool quit = SDL_FALSE;
	SDL_Cursor *cursor[3];
	int current;

	/* Load the SDL library */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	screen = SDL_SetVideoMode(320,200,8,SDL_ANYFORMAT);
	if (screen==NULL) {
		fprintf(stderr, "Couldn't initialize video mode: %s\n",SDL_GetError());
		return(1);
	}

	SDL_FillRect(screen, NULL, 0x664422);

	cursor[0] = SDL_CreateCursor((Uint8 *)cursor_data, (Uint8 *)cursor_mask,
		16, 16, 8, 8);
	if (cursor[0]==NULL) {
		fprintf(stderr, "Couldn't initialize test cursor: %s\n",SDL_GetError());
		SDL_Quit();
		return(1);
	}
	cursor[1] = create_arrow_cursor();
	if (cursor[1]==NULL) {
		fprintf(stderr, "Couldn't initialize arrow cursor: %s\n",SDL_GetError());
		SDL_FreeCursor(cursor[0]);
		SDL_Quit();
		return(1);
	}
	cursor[2] = SDL_CreateCursor(small_cursor_data, small_cursor_mask,
		8, 11, 3, 5);
	if (cursor[2]==NULL) {
		fprintf(stderr, "Couldn't initialize test cursor: %s\n",SDL_GetError());
		SDL_Quit();
		return(1);
	}

	current = 0;
	SDL_SetCursor(cursor[current]);

	while (!quit) {
		SDL_Event	event;
		while (SDL_PollEvent(&event)) {
			switch(event.type) {
				case SDL_MOUSEBUTTONDOWN:
					current = (current + 1)%3;
					SDL_SetCursor(cursor[current]);
					break;
				case SDL_KEYDOWN:
					if (event.key.keysym.sym == SDLK_ESCAPE) {
						quit = SDL_TRUE;
					}
					break;
				case SDL_QUIT:
					quit = SDL_TRUE;
					break;
			}
		}	
		SDL_Flip(screen);
		SDL_Delay(1);
	}

	SDL_FreeCursor(cursor[0]);
	SDL_FreeCursor(cursor[1]);
	SDL_FreeCursor(cursor[2]);

	SDL_Quit();
	return(0);
}